

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_segment.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> __thiscall
duckdb::ColumnSegment::CreateTransientSegment
          (ColumnSegment *this,DatabaseInstance *db,CompressionFunction *function,LogicalType *type,
          idx_t start,idx_t segment_size,BlockManager *block_manager)

{
  BufferManager *pBVar1;
  ColumnSegmentType local_cd;
  uint local_cc;
  shared_ptr<duckdb::BlockHandle,_true> block;
  idx_t segment_size_local;
  idx_t start_local;
  uint local_a8 [2];
  LogicalType local_a0;
  BaseStatistics local_88;
  
  segment_size_local = segment_size;
  start_local = start;
  pBVar1 = BufferManager::GetBufferManager(db);
  (*pBVar1->_vptr_BufferManager[0x11])(&block,pBVar1,segment_size,block_manager);
  local_cd = TRANSIENT;
  local_cc = 0;
  LogicalType::LogicalType(&local_a0,type);
  BaseStatistics::CreateEmpty(&local_88,&local_a0);
  local_a8[1] = 0xffffffff;
  local_a8[0] = 0;
  make_uniq<duckdb::ColumnSegment,duckdb::DatabaseInstance&,duckdb::shared_ptr<duckdb::BlockHandle,true>,duckdb::LogicalType_const&,duckdb::ColumnSegmentType,unsigned_long_const&,unsigned_int,duckdb::CompressionFunction&,duckdb::BaseStatistics,int,unsigned_int,unsigned_long_const&>
            ((duckdb *)this,db,&block,type,&local_cd,&start_local,&local_cc,function,&local_88,
             (int *)(local_a8 + 1),local_a8,&segment_size_local);
  BaseStatistics::~BaseStatistics(&local_88);
  LogicalType::~LogicalType(&local_a0);
  if (block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)
         (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>)this;
}

Assistant:

unique_ptr<ColumnSegment> ColumnSegment::CreateTransientSegment(DatabaseInstance &db, CompressionFunction &function,
                                                                const LogicalType &type, const idx_t start,
                                                                const idx_t segment_size, BlockManager &block_manager) {

	// Allocate a buffer for the uncompressed segment.
	auto &buffer_manager = BufferManager::GetBufferManager(db);
	D_ASSERT(&buffer_manager == &block_manager.buffer_manager);
	auto block = buffer_manager.RegisterTransientMemory(segment_size, block_manager);

	return make_uniq<ColumnSegment>(db, std::move(block), type, ColumnSegmentType::TRANSIENT, start, 0U, function,
	                                BaseStatistics::CreateEmpty(type), INVALID_BLOCK, 0U, segment_size);
}